

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void BuildBlockHistogramsCommand
               (uint16_t *data,size_t length,uint8_t *block_ids,size_t num_histograms,
               HistogramCommand *histograms)

{
  void *__s;
  ulong uVar1;
  ulong in_RCX;
  long lVar2;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  size_t i;
  size_t i_1;
  undefined8 local_60;
  undefined8 local_30;
  
  for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
    __s = (void *)(in_R8 + local_30 * 0xb10);
    memset(__s,0,0xb00);
    *(undefined8 *)((long)__s + 0xb00) = 0;
    *(undefined8 *)((long)__s + 0xb08) = 0x7ff0000000000000;
  }
  for (local_60 = 0; local_60 < in_RSI; local_60 = local_60 + 1) {
    lVar2 = in_R8 + (ulong)*(byte *)(in_RDX + local_60) * 0xb10;
    uVar1 = (ulong)*(ushort *)(in_RDI + local_60 * 2);
    *(int *)(lVar2 + uVar1 * 4) = *(int *)(lVar2 + uVar1 * 4) + 1;
    *(long *)(lVar2 + 0xb00) = *(long *)(lVar2 + 0xb00) + 1;
  }
  return;
}

Assistant:

static void FN(BuildBlockHistograms)(const DataType* data, const size_t length,
                                     const uint8_t* block_ids,
                                     const size_t num_histograms,
                                     HistogramType* histograms) {
  size_t i;
  FN(ClearHistograms)(histograms, num_histograms);
  for (i = 0; i < length; ++i) {
    FN(HistogramAdd)(&histograms[block_ids[i]], data[i]);
  }
}